

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

int __thiscall TPZSFMatrix<long_double>::Decompose_LDLt(TPZSFMatrix<long_double> *this)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int k;
  long lVar3;
  int k_1;
  long lVar4;
  long lVar5;
  long lVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar10;
  longdouble local_6c;
  longdouble local_48;
  
  cVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar1 != '\0') {
    if (cVar1 == '\x04') {
      return 0;
    }
    TPZMatrix<long_double>::Error
              ("virtual int TPZSFMatrix<long double>::Decompose_LDLt() [TVar = long double]",
               "Decompose_LDLt <Matrix already Decomposed with a different scheme>");
  }
  lVar5 = 1;
  for (lVar6 = 0;
      iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this), lVar6 < CONCAT44(extraout_var,iVar2);
      lVar6 = lVar6 + 1) {
    local_6c = (longdouble)0;
    lVar7 = in_ST1;
    lVar8 = in_ST2;
    in_ST1 = in_ST3;
    in_ST2 = in_ST4;
    in_ST3 = in_ST5;
    in_ST4 = in_ST6;
    for (lVar3 = 0; lVar6 != lVar3; lVar3 = lVar3 + 1) {
      lVar10 = in_ST4;
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar3,lVar3);
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar3,lVar6);
      lVar9 = in_ST0 * lVar7;
      in_ST0 = in_ST1;
      lVar7 = in_ST2;
      in_ST1 = in_ST4;
      in_ST2 = lVar10;
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar3,lVar6);
      local_6c = local_6c + lVar9 * lVar8;
      lVar8 = in_ST3;
      in_ST3 = lVar10;
      in_ST4 = lVar10;
    }
    (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0x24])(this,lVar6,lVar6);
    local_48 = in_ST0 - local_6c;
    in_ST5 = in_ST4;
    (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0x23])(this,lVar6,lVar6,&local_48);
    in_ST0 = lVar8;
    (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0x24])(this,lVar6,lVar6);
    lVar3 = lVar5;
    in_ST6 = in_ST5;
    if (ABS(lVar7) < (longdouble)1e-16) {
      TPZMatrix<long_double>::Error
                ("virtual int TPZSFMatrix<long double>::Decompose_LDLt() [TVar = long double]",
                 "Decompose_LDLt <Zero on diagonal>");
    }
    for (; iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                     _vptr_TPZSavable[0xc])(this), lVar3 < CONCAT44(extraout_var_00,iVar2);
        lVar3 = lVar3 + 1) {
      local_6c = (longdouble)0;
      lVar7 = in_ST1;
      lVar8 = in_ST2;
      in_ST1 = in_ST3;
      in_ST2 = in_ST4;
      in_ST3 = in_ST5;
      in_ST4 = in_ST6;
      for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
        lVar10 = in_ST4;
        (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(this,lVar4,lVar4);
        (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(this,lVar6,lVar4);
        lVar9 = in_ST0 * lVar7;
        in_ST0 = in_ST1;
        lVar7 = in_ST2;
        in_ST1 = in_ST4;
        in_ST2 = lVar10;
        (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(this,lVar3,lVar4);
        local_6c = local_6c + lVar9 * lVar8;
        lVar8 = in_ST3;
        in_ST3 = lVar10;
        in_ST4 = lVar10;
      }
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar3,lVar6);
      local_6c = in_ST0 - local_6c;
      in_ST0 = lVar8;
      in_ST5 = in_ST4;
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(this,lVar6,lVar6);
      local_48 = local_6c / lVar7;
      in_ST6 = in_ST5;
      (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(this,lVar3,lVar6,&local_48);
    }
    lVar5 = lVar5 + 1;
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

int
TPZSFMatrix<TVar> ::Decompose_LDLt()
{
	if (  this->fDecomposed && this->fDecomposed != ELDLt)
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Decompose_LDLt <Matrix already Decomposed with a different scheme>" );
	else if ( this->fDecomposed ) return 0;
	
	//	TVar sum;
	
	
	for ( auto j = 0; j < this->Dim(); j++ )
    {
		TVar sum=0.;
		for ( auto k=0; k<j; k++){
			if constexpr (is_complex<TVar>::value){
				sum+=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
			}else{
				sum+=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
			}
		}
		PutVal(j,j,GetVal(j,j)-sum);
		if ( IsZero(GetVal(j,j)) )TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Decompose_LDLt <Zero on diagonal>" );
		for( auto l=j+1; l<this->Dim();l++)
		{
			sum = 0;
			for ( auto k=0; k<j; k++){
				if constexpr(is_complex<TVar>::value){
					sum+=GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
				}else{
					sum+=GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
				}
			}
			PutVal(l,j, (GetVal(l,j)-sum)/GetVal(j,j) );
		}
		
    }
	this->fDecomposed  = ELDLt;
	this->fDefPositive = 0;
	
    
	return( 1 );
}